

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_HitWater(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  double sec_00;
  sector_t *thing;
  int iVar1;
  VMValue *pVVar2;
  bool bVar3;
  VMValue *local_90;
  bool local_83;
  TVector3<double> local_80;
  uint local_68;
  bool local_63;
  bool local_62;
  bool local_61;
  int u;
  bool force;
  bool alert;
  bool checkabove;
  double z;
  double y;
  double x;
  sector_t *sec;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181a,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181a,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  sec = (sector_t *)(param->field_0).field_1.a;
  local_83 = true;
  if (sec != (sector_t *)0x0) {
    local_83 = DObject::IsKindOf((DObject *)sec,AActor::RegistrationInfo.MyClass);
  }
  if (local_83 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181a,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  self._0_4_ = (int)self + 1;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181b,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[(int)self].Count != '\x03') {
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181b,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (defaultparam_local[(int)self].Array == (VMValue *)0x0) {
    NullParam("\"sec\"");
    local_90 = defaultparam_local[(int)self].Array;
  }
  else {
    local_90 = defaultparam_local[(int)self].Array;
  }
  x = (double)local_90;
  iVar1 = (int)self + 1;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181c,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181c,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  y = (double)defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 2;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181d,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181d,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  z = (double)defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 3;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181e,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181e,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  _u = defaultparam_local[iVar1].Array;
  self._0_4_ = (int)self + 4;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x181f,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar1 = *(int *)&defaultparam_local[(int)self].Array;
  }
  else {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x181f,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    iVar1 = (pVVar2->field_0).i;
  }
  local_61 = iVar1 != 0;
  self._0_4_ = (int)self + 1;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1820,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar1 = *(int *)&defaultparam_local[(int)self].Array;
  }
  else {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1820,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    iVar1 = (pVVar2->field_0).i;
  }
  local_62 = iVar1 != 0;
  self._0_4_ = (int)self + 1;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1821,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar1 = *(int *)&defaultparam_local[(int)self].Array;
  }
  else {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1821,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    iVar1 = (pVVar2->field_0).i;
  }
  thing = sec;
  sec_00 = x;
  local_63 = iVar1 != 0;
  TVector3<double>::TVector3(&local_80,y,z,(double)_u);
  bVar3 = P_HitWater((AActor *)thing,(sector_t *)sec_00,&local_80,(bool)(local_61 & 1),
                     (bool)(local_62 & 1),(bool)(local_63 & 1));
  local_68 = (uint)bVar3;
  if (self._4_4_ < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (_paramnum == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1822,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(_paramnum,local_68);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, HitWater)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_POINTER_NOT_NULL(sec, sector_t);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL_DEF(checkabove);
	PARAM_BOOL_DEF(alert);
	PARAM_BOOL_DEF(force);
	ACTION_RETURN_BOOL(P_HitWater(self, sec, DVector3(x, y, z), checkabove, alert, force));
}